

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O1

void __thiscall
capnp::_::anon_unknown_0::RpcConnectionState::releaseExport
          (RpcConnectionState *this,ExportId id,uint refcount)

{
  Disposer *pDVar1;
  ClientHook *pCVar2;
  undefined8 *puVar3;
  PromiseNode *pPVar4;
  Export *pEVar5;
  uint uVar6;
  ulong uVar7;
  Disposer *disposerCopy;
  ulong uVar8;
  Fault f;
  Fault local_60;
  uint local_58;
  Disposer *local_50;
  ClientHook *local_48;
  undefined8 *local_40;
  PromiseNode *local_38;
  
  uVar8 = (ulong)id;
  pEVar5 = (this->exports).slots.builder.ptr;
  uVar7 = ((long)(this->exports).slots.builder.pos - (long)pEVar5 >> 3) * -0x3333333333333333;
  if ((uVar7 < uVar8 || uVar7 - uVar8 == 0) || (pEVar5[uVar8].refcount == 0)) {
    pEVar5 = (Export *)0x0;
  }
  else {
    pEVar5 = pEVar5 + uVar8;
  }
  if (pEVar5 == (Export *)0x0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[36]>
              (&local_60,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
               ,0xa65,FAILED,(char *)0x0,"\"Tried to release invalid export ID.\"",
               (char (*) [36])"Tried to release invalid export ID.");
    kj::_::Debug::Fault::~Fault(&local_60);
  }
  else {
    uVar6 = pEVar5->refcount - refcount;
    if (pEVar5->refcount < refcount) {
      _GLOBAL__N_1::RpcConnectionState::releaseExport();
    }
    else {
      pEVar5->refcount = uVar6;
      if (uVar6 == 0) {
        local_60.exception = (Exception *)(pEVar5->clientHook).ptr;
        std::
        _Hashtable<capnp::ClientHook_*,_std::pair<capnp::ClientHook_*const,_unsigned_int>,_std::allocator<std::pair<capnp::ClientHook_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<capnp::ClientHook_*>,_std::hash<capnp::ClientHook_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::_M_erase(&(this->exportsByCap)._M_h,&local_60);
        local_60.exception._0_4_ = id;
        pEVar5 = (this->exports).slots.builder.ptr;
        local_58 = pEVar5[uVar8].refcount;
        pDVar1 = pEVar5[uVar8].clientHook.disposer;
        pCVar2 = pEVar5[uVar8].clientHook.ptr;
        pEVar5[uVar8].clientHook.ptr = (ClientHook *)0x0;
        puVar3 = &(pEVar5[uVar8].resolveOp.super_PromiseBase.node.disposer)->_vptr_Disposer;
        pPVar4 = pEVar5[uVar8].resolveOp.super_PromiseBase.node.ptr;
        pEVar5[uVar8].refcount = 0;
        pEVar5[uVar8].clientHook.disposer = (Disposer *)0x0;
        pEVar5[uVar8].clientHook.ptr = (ClientHook *)0x0;
        pEVar5[uVar8].resolveOp.super_PromiseBase.node.disposer = (Disposer *)0x0;
        pEVar5[uVar8].resolveOp.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
        local_50 = pDVar1;
        local_48 = pCVar2;
        local_40 = puVar3;
        local_38 = pPVar4;
        std::
        priority_queue<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::greater<unsigned_int>_>
        ::push(&(this->exports).freeIds,(value_type *)&local_60);
        if (pPVar4 != (PromiseNode *)0x0) {
          local_38 = (PromiseNode *)0x0;
          (**(code **)*puVar3)
                    (puVar3,(_func_int *)
                            ((long)&pPVar4->_vptr_PromiseNode + (long)pPVar4->_vptr_PromiseNode[-2])
                    );
        }
        if (pCVar2 != (ClientHook *)0x0) {
          local_48 = (ClientHook *)0x0;
          (**pDVar1->_vptr_Disposer)
                    (pDVar1,(_func_int *)
                            ((long)&pCVar2->_vptr_ClientHook + (long)pCVar2->_vptr_ClientHook[-2]));
        }
      }
    }
  }
  return;
}

Assistant:

void releaseExport(ExportId id, uint refcount) {
    KJ_IF_MAYBE(exp, exports.find(id)) {
      KJ_REQUIRE(refcount <= exp->refcount, "Tried to drop export's refcount below zero.") {
        return;
      }

      exp->refcount -= refcount;
      if (exp->refcount == 0) {
        exportsByCap.erase(exp->clientHook);
        exports.erase(id, *exp);
      }
    } else {
      KJ_FAIL_REQUIRE("Tried to release invalid export ID.") {
        return;
      }